

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

permonst * grow_up(monst *mtmp,monst *victim)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  int local_48;
  int local_44;
  permonst *local_40;
  permonst *ptr;
  int hp_threshold;
  int lev_limit;
  int cur_increase;
  int max_increase;
  int newtype;
  int oldtype;
  monst *victim_local;
  monst *mtmp_local;
  
  local_40 = mtmp->data;
  if (mtmp->mhp < 1) {
    return (permonst *)0x0;
  }
  iVar3 = monsndx(local_40);
  cur_increase = little_to_big(iVar3);
  if ((cur_increase == 0x161) && ((*(uint *)&mtmp->field_0x60 & 1) != 0)) {
    cur_increase = 0x162;
  }
  if (victim == (monst *)0x0) {
    hp_threshold = rnd(8);
    ptr._0_4_ = 0;
    ptr._4_4_ = 0x32;
    lev_limit = hp_threshold;
  }
  else {
    bVar1 = mtmp->m_lev;
    ptr._0_4_ = (uint)bVar1 * 8;
    if (mtmp->m_lev == '\0') {
      ptr._0_4_ = 4;
    }
    else if (local_40->mlet == '7') {
      ptr._0_4_ = (mtmp->mhpmax / 10 + 1) * 10 + -1;
    }
    else {
      bVar2 = is_home_elemental(&mtmp->dlevel->z,local_40);
      if (bVar2 != '\0') {
        ptr._0_4_ = (uint)bVar1 * 0x18;
      }
    }
    ptr._4_4_ = (local_40->mlevel * 3) / 2;
    if ((iVar3 != cur_increase) && ((int)ptr._4_4_ < (int)mons[cur_increase].mlevel)) {
      ptr._4_4_ = (uint)mons[cur_increase].mlevel;
    }
    lev_limit = rnd(victim->m_lev + 1);
    if ((int)ptr + 1 < mtmp->mhpmax + lev_limit) {
      if (((int)ptr + 1) - mtmp->mhpmax < 1) {
        local_44 = 0;
      }
      else {
        local_44 = ((int)ptr + 1) - mtmp->mhpmax;
      }
      lev_limit = local_44;
    }
    if (lev_limit < 2) {
      local_48 = 0;
    }
    else {
      local_48 = rn2(lev_limit);
    }
    hp_threshold = local_48;
  }
  mtmp->mhpmax = lev_limit + mtmp->mhpmax;
  mtmp->mhp = hp_threshold + mtmp->mhp;
  if (mtmp->mhpmax <= (int)ptr) {
    return local_40;
  }
  if ((local_40 < mons + 0x159) || (mons + 0x168 < local_40)) {
    if ((int)ptr._4_4_ < 5) {
      ptr._4_4_ = 5;
    }
    else if ((0x31 < (int)ptr._4_4_) && (ptr._4_4_ = 0x31, '1' < local_40->mlevel)) {
      ptr._4_4_ = 0x32;
    }
  }
  else {
    ptr._4_4_ = 0x1e;
  }
  bVar1 = mtmp->m_lev + 1;
  mtmp->m_lev = bVar1;
  if (((int)(uint)bVar1 < (int)mons[cur_increase].mlevel) || (cur_increase == iVar3))
  goto LAB_0020d108;
  lVar7 = (long)cur_increase;
  local_40 = mons + lVar7;
  if ((mvitals[cur_increase].mvflags & 2) != 0) {
    if (((((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar4 = which_armor(mtmp,4), poVar4 == (obj *)0x0 ||
          (poVar4 = which_armor(mtmp,4), poVar4->otyp != 0x4f)))) &&
        (((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
          (((((u.uprops[0x19].intrinsic != 0 ||
              ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
             (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)) &&
           (u.uprops[0x19].blocked == 0)))) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar3 < 0x41)))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar2 = match_warn_of_mon(mtmp), bVar2 != '\0')))) {
      pcVar5 = mon_nam(mtmp);
      pcVar6 = mons_mname(local_40);
      pcVar6 = an(pcVar6);
      iVar3 = pronoun_gender(level,mtmp);
      bVar9 = true;
      if (((mons[lVar7].mlet != '7') && (bVar9 = true, (mons[lVar7].mflags2 & 2) == 0)) &&
         (bVar9 = true, mons[lVar7].mlet != '\x16')) {
        bVar9 = local_40 == mons + 0x33;
      }
      pcVar8 = "dies";
      if (bVar9) {
        pcVar8 = "expires";
      }
      pline("As %s grows up into %s, %s %s!",pcVar5,pcVar6,genders[iVar3].he,pcVar8);
    }
    set_mon_data(mtmp,local_40,-1);
    mondied(mtmp);
    return (permonst *)0x0;
  }
  if (flags.verbose != '\0') {
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].intrinsic != 0 ||
            ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
          (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))
      goto LAB_0020ce4b;
LAB_0020ced8:
      if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
           ((poVar4 = which_armor(mtmp,4), poVar4 != (obj *)0x0 &&
            (poVar4 = which_armor(mtmp,4), poVar4->otyp == 0x4f)))) ||
          (((((u.uprops[0x1e].intrinsic == 0 &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
              ((((u.uprops[0x19].intrinsic == 0 &&
                 ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
                (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
            (u.uprops[0x19].blocked != 0)) &&
           (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
            (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
         (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
          (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) goto LAB_0020d0d6;
    }
    else {
      bVar2 = worm_known(level,mtmp);
      if (bVar2 == '\0') goto LAB_0020ced8;
LAB_0020ce4b:
      if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
            (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
          (((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 ||
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)))) || (((byte)u._1052_1_ >> 5 & 1) != 0))
      goto LAB_0020ced8;
    }
    pcVar5 = y_monnam(mtmp);
    pcVar5 = upstart(pcVar5);
    pcVar6 = mons_mname(local_40);
    pcVar6 = an(pcVar6);
    pline("%s grows up into %s!",pcVar5,pcVar6);
  }
LAB_0020d0d6:
  set_mon_data(mtmp,local_40,1);
  newsym((int)mtmp->mx,(int)mtmp->my);
  ptr._4_4_ = (uint)mtmp->m_lev;
LAB_0020d108:
  if (((int)ptr._4_4_ < (int)(uint)mtmp->m_lev) &&
     (mtmp->m_lev = mtmp->m_lev + 0xff, mtmp->mhpmax == (int)ptr + 1)) {
    mtmp->mhpmax = mtmp->mhpmax + -1;
  }
  if (400 < mtmp->mhpmax) {
    mtmp->mhpmax = 400;
  }
  if (mtmp->mhpmax < mtmp->mhp) {
    mtmp->mhp = mtmp->mhpmax;
  }
  return local_40;
}

Assistant:

const struct permonst *grow_up(struct monst *mtmp, /* `mtmp' might "grow up" into a bigger version */
			 struct monst *victim)
{
	int oldtype, newtype, max_increase, cur_increase,
	    lev_limit, hp_threshold;
	const struct permonst *ptr = mtmp->data;

	/* monster died after killing enemy but before calling this function */
	/* currently possible if killing a gas spore */
	if (mtmp->mhp <= 0)
	    return NULL;

	/* note:  none of the monsters with special hit point calculations
	   have both little and big forms */
	oldtype = monsndx(ptr);
	newtype = little_to_big(oldtype);
	if (newtype == PM_PRIEST && mtmp->female) newtype = PM_PRIESTESS;

	/* growth limits differ depending on method of advancement */
	if (victim) {		/* killed a monster */
	    /*
	     * The HP threshold is the maximum number of hit points for the
	     * current level; once exceeded, a level will be gained.
	     * Possible bug: if somehow the hit points are already higher
	     * than that, monster will gain a level without any increase in HP.
	     */
	    hp_threshold = mtmp->m_lev * 8;		/* normal limit */
	    if (!mtmp->m_lev)
		hp_threshold = 4;
	    else if (is_golem(ptr))	/* strange creatures */
		hp_threshold = ((mtmp->mhpmax / 10) + 1) * 10 - 1;
	    else if (is_home_elemental(&mtmp->dlevel->z, ptr))
		hp_threshold *= 3;
	    lev_limit = 3 * (int)ptr->mlevel / 2;	/* same as adj_lev() */
	    /* If they can grow up, be sure the level is high enough for that */
	    if (oldtype != newtype && mons[newtype].mlevel > lev_limit)
		lev_limit = (int)mons[newtype].mlevel;
	    /* number of hit points to gain; unlike for the player, we put
	       the limit at the bottom of the next level rather than the top */
	    max_increase = rnd((int)victim->m_lev + 1);
	    if (mtmp->mhpmax + max_increase > hp_threshold + 1)
		max_increase = max((hp_threshold + 1) - mtmp->mhpmax, 0);
	    cur_increase = (max_increase > 1) ? rn2(max_increase) : 0;
	} else {
	    /* a gain level potion or wraith corpse; always go up a level
	       unless already at maximum (49 is hard upper limit except
	       for demon lords, who start at 50 and can't go any higher) */
	    max_increase = cur_increase = rnd(8);
	    hp_threshold = 0;	/* smaller than `mhpmax + max_increase' */
	    lev_limit = 50;		/* recalc below */
	}

	mtmp->mhpmax += max_increase;
	mtmp->mhp += cur_increase;
	if (mtmp->mhpmax <= hp_threshold)
	    return ptr;		/* doesn't gain a level */

	if (is_mplayer(ptr)) lev_limit = 30;	/* same as player */
	else if (lev_limit < 5) lev_limit = 5;	/* arbitrary */
	else if (lev_limit > 49) lev_limit = (ptr->mlevel > 49 ? 50 : 49);

	if ((int)++mtmp->m_lev >= mons[newtype].mlevel && newtype != oldtype) {
	    ptr = &mons[newtype];
	    if (mvitals[newtype].mvflags & G_GENOD) {	/* allow G_EXTINCT */
		if (sensemon(mtmp))
		    pline("As %s grows up into %s, %s %s!", mon_nam(mtmp),
			an(mons_mname(ptr)), mhe(level, mtmp),
			nonliving(ptr) ? "expires" : "dies");
		set_mon_data(mtmp, ptr, -1);	/* keep mvitals[] accurate */
		mondied(mtmp);
		return NULL;
	    }
	    if (flags.verbose && canspotmon(level, mtmp)) {
		pline("%s grows up into %s!",
		      upstart(y_monnam(mtmp)), an(mons_mname(ptr)));
	    }
	    set_mon_data(mtmp, ptr, 1);		/* preserve intrinsics */
	    newsym(mtmp->mx, mtmp->my);		/* color may change */
	    lev_limit = (int)mtmp->m_lev;	/* never undo increment */
	}
	/* sanity checks */
	if ((int)mtmp->m_lev > lev_limit) {
	    mtmp->m_lev--;	/* undo increment */
	    /* HP might have been allowed to grow when it shouldn't */
	    if (mtmp->mhpmax == hp_threshold + 1) mtmp->mhpmax--;
	}
	if (mtmp->mhpmax > 50*8) mtmp->mhpmax = 50*8;	  /* absolute limit */
	if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;

	return ptr;
}